

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tag.cpp
# Opt level: O1

void __thiscall Tag::~Tag(Tag *this)

{
  StreamObject *pSVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  uint uVar4;
  pointer ppSVar5;
  ulong uVar6;
  
  (this->super_StreamObject)._vptr_StreamObject = (_func_int **)&PTR_write_0010ab60;
  ppSVar5 = (this->_streamObjects).
            super__Vector_base<StreamObject_*,_std::allocator<StreamObject_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->_streamObjects).super__Vector_base<StreamObject_*,_std::allocator<StreamObject_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppSVar5) {
    uVar4 = 1;
    uVar6 = 0;
    do {
      pSVar1 = ppSVar5[uVar6];
      if (pSVar1 != (StreamObject *)0x0) {
        pSVar1->_vptr_StreamObject = (_func_int **)&PTR_write_0010ab00;
        pcVar2 = (pSVar1->_name)._M_dataplus._M_p;
        paVar3 = &(pSVar1->_name).field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar2 != paVar3) {
          operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
        }
        operator_delete(pSVar1,0x40);
        (this->_streamObjects).super__Vector_base<StreamObject_*,_std::allocator<StreamObject_*>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar6] = (StreamObject *)0x0;
      }
      uVar6 = (ulong)uVar4;
      ppSVar5 = (this->_streamObjects).
                super__Vector_base<StreamObject_*,_std::allocator<StreamObject_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar4 = uVar4 + 1;
    } while (uVar6 < (ulong)((long)(this->_streamObjects).
                                   super__Vector_base<StreamObject_*,_std::allocator<StreamObject_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar5 >> 3))
    ;
  }
  if (ppSVar5 != (pointer)0x0) {
    operator_delete(ppSVar5,(long)(this->_streamObjects).
                                  super__Vector_base<StreamObject_*,_std::allocator<StreamObject_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppSVar5
                   );
  }
  (this->super_StreamObject)._vptr_StreamObject = (_func_int **)&PTR_write_0010ab00;
  pcVar2 = (this->super_StreamObject)._name._M_dataplus._M_p;
  paVar3 = &(this->super_StreamObject)._name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

Tag::~Tag()
{
	//std::cout << __PRETTY_FUNCTION__ << std::endl;

	for ( unsigned int i = 0; i < _streamObjects.size();i++ )
	{
		if ( _streamObjects[i] != NULL )
		{
			delete _streamObjects[i];
			_streamObjects[i] = NULL;
		}
	}
}